

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vocab.c
# Opt level: O1

int vocgobj(voccxdef *ctx,char **cmd,int *typelist,int cur,int *next,int complain,vocoldef *nounlist
           ,int multi,int chkact,int *no_match)

{
  runsdef *prVar1;
  vocoldef *pvVar2;
  vocoldef *pvVar3;
  undefined8 *puVar4;
  undefined8 *puVar5;
  undefined4 *puVar6;
  undefined4 *puVar7;
  char cVar8;
  runcxdef *ctx_00;
  runsdef *prVar9;
  ushort *puVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined1 uVar20;
  undefined1 *puVar21;
  byte bVar22;
  uint16_t tmp_1;
  objnum oVar23;
  uint uVar24;
  int iVar25;
  int iVar26;
  uint uVar27;
  uchar *puVar28;
  size_t sVar29;
  vocoldef *pvVar30;
  vocoldef *pvVar31;
  ushort **ppuVar32;
  ulong uVar33;
  int extraout_EDX;
  int extraout_EDX_00;
  int *extraout_RDX;
  vocoldef *pvVar34;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar35;
  undefined8 extraout_RDX_02;
  char *pcVar36;
  int *piVar37;
  long extraout_RDX_03;
  long extraout_RDX_04;
  long extraout_RDX_05;
  long extraout_RDX_06;
  long extraout_RDX_07;
  long extraout_RDX_08;
  long extraout_RDX_09;
  long extraout_RDX_10;
  long extraout_RDX_11;
  long extraout_RDX_12;
  long extraout_RDX_13;
  long extraout_RDX_14;
  long extraout_RDX_15;
  vocoldef *pvVar38;
  undefined8 uVar39;
  long lVar40;
  voccxdef *ctx_01;
  uint uVar41;
  uint uVar42;
  int iVar43;
  int iVar44;
  long lVar45;
  ulong uVar46;
  uint lstsiz;
  uint uVar47;
  uint uVar48;
  bool bVar49;
  bool bVar50;
  int *local_130;
  ulong local_128;
  uint local_114;
  ulong local_100;
  uint local_f4;
  uint *local_f0;
  int local_e4;
  vocoldef *local_e0;
  vocoldef *local_d8;
  uint local_cc;
  voccxdef *local_c8;
  int local_bc;
  int local_b8;
  uint local_b4;
  uchar *lstp;
  int local_a8;
  uint local_a4;
  long local_a0;
  vocoldef *local_98;
  vocoldef *local_90;
  undefined4 local_84;
  vocoldef *local_80;
  vocoldef *local_78;
  int local_70;
  uint local_6c;
  int *local_68;
  int *local_60;
  int *local_58;
  char *local_50;
  ulong local_48;
  runsdef val;
  
  pvVar34 = (vocoldef *)ctx->voc_stk_cur;
  pvVar38 = pvVar34 + 200;
  local_bc = complain;
  if (pvVar38 <= (vocoldef *)ctx->voc_stk_end) {
    ctx->voc_stk_cur = (uchar *)pvVar38;
    pvVar30 = pvVar34 + 0xd2;
    pvVar31 = (vocoldef *)ctx->voc_stk_end;
    if (pvVar30 <= pvVar31) {
      local_130 = (int *)(ulong)(uint)cur;
      bVar49 = chkact != 0;
      local_50 = ". Checking for actor\\n";
      if (!bVar49) {
        local_50 = ". Reading noun phrase\\n";
      }
      local_70 = (uint)bVar49 * 3 + 5;
      local_48 = (ulong)(bVar49 || multi == 0);
      local_58 = &pvVar34[1].vocolflg;
      local_68 = &pvVar34->vocolflg;
      uVar42 = 1;
      uVar41 = 0;
      local_f0 = (uint *)next;
      local_d8 = pvVar34;
      local_c8 = ctx;
      local_60 = local_68;
      do {
        ctx_01 = local_c8;
        ctx->voc_stk_cur = (uchar *)pvVar30;
        pvVar34 = pvVar38 + 0x1e;
        if (pvVar31 < pvVar34) break;
        ctx->voc_stk_cur = (uchar *)pvVar34;
        pvVar2 = pvVar38 + 0x28;
        if (pvVar31 < pvVar2) break;
        ctx->voc_stk_cur = (uchar *)pvVar2;
        pvVar3 = pvVar38 + 0x3c;
        local_90 = pvVar2;
        if (pvVar31 < pvVar3) break;
        ctx->voc_stk_cur = (uchar *)pvVar3;
        if (pvVar31 < &pvVar38[0x3f].vocolfst) break;
        ctx->voc_stk_cur = (uchar *)&pvVar38[0x3f].vocolfst;
        if (no_match != (int *)0x0) {
          *no_match = 0;
        }
        uVar48 = (uint)local_130;
        *local_f0 = uVar48;
        uVar47 = 0;
        local_e0 = pvVar38;
        local_6c = uVar42;
        if ((uVar48 == 0xffffffff) ||
           (lVar45 = (long)(int)uVar48, local_98 = pvVar3, local_80 = pvVar30, local_78 = pvVar34,
           cmd[lVar45] == (char *)0x0)) goto LAB_001f6ffa;
        piVar37 = no_match;
        if ((local_c8->voccxflg & 4) != 0) {
          outformat(local_50);
          piVar37 = extraout_RDX;
        }
        iVar25 = 2;
        uVar42 = (uint)piVar37;
        if (ctx_01->voccxpnp == 0xffff) {
LAB_001f66ba:
          pvVar31 = (vocoldef *)0x0;
          pvVar38 = pvVar30;
        }
        else {
          ctx_00 = ctx_01->voccxrun;
          val.runstyp = (uchar)local_70;
          pvVar30 = (vocoldef *)&val;
          runpush(ctx_00,local_70,(runsdef *)pvVar30);
          iVar25 = (uint)(local_bc != 0) * 3 + 5;
          val.runstyp = (uchar)iVar25;
          runpush(ctx_00,iVar25,(runsdef *)pvVar30);
          runpnum(ctx_00,(long)(int)(uVar48 + 1));
          pcVar36 = *cmd;
          lstsiz = 0;
          uVar46 = 0;
          if (pcVar36 != (char *)0x0) {
            uVar46 = 0;
            do {
              if (*pcVar36 == '\0') break;
              pcVar36 = cmd[uVar46 + 1];
              uVar46 = uVar46 + 1;
            } while (pcVar36 != (char *)0x0);
          }
          uVar47 = (uint)uVar46;
          puVar28 = voc_push_list_siz(ctx_01,uVar47 * 5);
          if (uVar47 != 0) {
            uVar33 = 0;
            do {
              *puVar28 = '\x01';
              *(int *)(puVar28 + 1) = typelist[uVar33];
              puVar28 = puVar28 + 5;
              uVar33 = uVar33 + 1;
            } while ((uVar46 & 0xffffffff) != uVar33);
            pvVar30 = (vocoldef *)0x0;
            lstsiz = 0;
            do {
              sVar29 = strlen(cmd[(long)pvVar30]);
              lstsiz = lstsiz + (int)sVar29 + 3;
              pvVar30 = (vocoldef *)((long)&pvVar30->vocolobj + 1);
            } while (uVar47 != (uint)pvVar30);
          }
          puVar28 = voc_push_list_siz(ctx_01,lstsiz);
          if (uVar47 != 0) {
            lVar40 = 0;
            do {
              *puVar28 = '\x03';
              pvVar30 = (vocoldef *)strlen(cmd[lVar40]);
              *(short *)(puVar28 + 1) = (short)pvVar30 + 2;
              memcpy(puVar28 + 3,cmd[lVar40],(size_t)pvVar30);
              puVar28 = puVar28 + (long)pvVar30 + 3;
              lVar40 = lVar40 + 1;
            } while (uVar47 != (uint)lVar40);
          }
          ctx_01 = local_c8;
          runfn(ctx_00,local_c8->voccxpnp,5);
          pvVar38 = local_d8;
          prVar9 = ctx_00->runcxsp;
          prVar1 = prVar9 + -1;
          bVar22 = prVar9[-1].runstyp;
          uVar42 = (uint)bVar22;
          if (bVar22 == 7) {
            ctx_00->runcxsp = prVar1;
            if (prVar1->runstyp != '\a') {
              ctx_00->runcxerr->errcxptr->erraac = 0;
              runsign(ctx_00,0x3fc);
            }
            puVar10 = (ushort *)prVar9[-1].runsv.runsvstr;
            local_f4 = *puVar10 - 2;
            lstp = (uchar *)(puVar10 + 1);
            iVar25 = 2;
            pvVar31 = (vocoldef *)0x0;
            pvVar34 = (vocoldef *)(ulong)local_f4;
            if ((1 < local_f4) && ((char)*(ushort *)lstp == '\x01')) {
              uVar24 = *(int *)((long)puVar10 + 3) - 1;
              *local_f0 = uVar24;
              uVar42 = uVar48;
              if (((int)uVar24 < (int)uVar48) || (uVar42 = uVar47, (int)uVar47 < (int)uVar24)) {
                *local_f0 = uVar42;
              }
              lstadv(&lstp,&local_f4);
              if (local_f4 != 0) {
                bVar49 = false;
                uVar42 = 0;
LAB_001f676e:
                do {
                  if (*lstp == '\x05') {
                    oVar23 = 0xffff;
                  }
                  else {
                    if (*lstp != '\x02') {
                      lstadv(&lstp,&local_f4);
                      if ((bool)(local_f4 == 0 | bVar49)) {
                        pvVar31 = (vocoldef *)(ulong)uVar42;
                        goto LAB_001f687c;
                      }
                      goto LAB_001f676e;
                    }
                    oVar23 = *(objnum *)(lstp + 1);
                  }
                  pvVar38->vocolobj = oVar23;
                  lstadv(&lstp,&local_f4);
                  if ((local_f4 == 0) || (*lstp != '\x01')) {
                    pvVar38->vocolflg = 0;
                  }
                  else {
                    pvVar38->vocolflg = *(int *)(lstp + 1);
                    lstadv(&lstp,&local_f4);
                  }
                  *(anon_union_8_4_1dda36f5_for_runsv *)&pvVar38->vocolfst =
                       *(anon_union_8_4_1dda36f5_for_runsv *)(cmd + lVar45);
                  pvVar38->vocollst = cmd[(long)(int)*local_f0 + -1];
                  pvVar38 = pvVar38 + 1;
                  pvVar31 = (vocoldef *)(ulong)(uVar42 + 1);
                  bVar49 = 0xc5 < uVar42;
                  if ((local_f4 == 0) || (bVar50 = 0xc5 < uVar42, uVar42 = uVar42 + 1, bVar50))
                  goto LAB_001f687c;
                } while( true );
              }
              pvVar31 = (vocoldef *)0x0;
LAB_001f687c:
              pvVar38->vocolobj = 0xffff;
              pvVar38->vocolflg = 0;
              if (no_match != (int *)0x0) {
                uVar42 = 0;
                if ((int)pvVar31 == 0) {
                  uVar42 = (uint)((int)uVar48 < (int)*local_f0);
                }
                *no_match = uVar42;
              }
              lVar40 = lVar45;
              if ((int)uVar48 < (int)*local_f0) {
                do {
                  if ((*(byte *)(typelist + lVar40) & 0x80) != 0) {
                    ctx_01->voccxunknown = ctx_01->voccxunknown + -1;
                  }
                  lVar40 = lVar40 + 1;
                } while (lVar40 < (int)*local_f0);
              }
              iVar25 = 3;
              pvVar30 = pvVar31;
              pvVar34 = local_d8;
              if (0 < (int)pvVar31) {
                do {
                  if ((local_d8->vocolflg & 0x800) != 0) {
                    ctx_01->voccxunknown = ctx_01->voccxunknown + 1;
                  }
                  uVar42 = (int)pvVar30 - 1;
                  pvVar30 = (vocoldef *)(ulong)uVar42;
                } while (uVar42 != 0);
              }
            }
            uVar42 = (uint)pvVar34;
          }
          else {
            if (bVar22 == 1) {
              ctx_00->runcxsp = prVar1;
              if (prVar1->runstyp != '\x01') {
                ctx_00->runcxerr->errcxptr->erraac = 0;
                runsign(ctx_00,0x3eb);
              }
              iVar25 = *(int *)&prVar9[-1].runsv;
              uVar42 = (uint)bVar22;
              goto LAB_001f66ba;
            }
            ctx_00->runcxsp = prVar1;
            pvVar31 = (vocoldef *)0x0;
            iVar25 = 2;
            pvVar38 = pvVar30;
          }
        }
        uVar47 = 0xffffffff;
        if (iVar25 == 2) {
          bVar22 = *cmd[lVar45];
          uVar39 = CONCAT71((int7)((ulong)pvVar38 >> 8),bVar22);
          uVar47 = (uint)bVar22;
          uVar24 = (uint)pvVar31;
          if ((1 < uVar47 - 0x41) && (uVar47 != 0x59)) {
            if (uVar47 != 0x22) {
              bVar49 = false;
              goto LAB_001f6b8f;
            }
            if (chkact == 0) {
              if ((ctx_01->voccxflg & 4) != 0) {
                outformat("... found quoted string\\n");
              }
              local_d8[(int)uVar24].vocolobj = 0xffff;
              local_d8[(int)uVar24].vocolflg = 0x400;
              pcVar36 = cmd[lVar45];
              local_d8[(int)uVar24].vocollst = pcVar36;
              local_d8[(int)uVar24].vocolfst = pcVar36;
              *local_f0 = uVar48 + 1;
              uVar47 = uVar24 + 1;
              goto LAB_001f6ffa;
            }
LAB_001f6bad:
            uVar47 = 0;
            goto LAB_001f6ffa;
          }
          if (cmd[(long)(int)uVar48 + 1] == (char *)0x0) {
            bVar49 = false;
LAB_001f6b8f:
            pvVar38 = local_d8;
            lVar45 = (long)(int)local_130;
            bVar22 = *cmd[lVar45];
            if ((bVar49) || (bVar22 != 0x41)) {
              if (bVar22 < 0x52) {
                if (bVar22 == 0x49) {
                  iVar25 = 4;
                }
                else {
                  if (bVar22 != 0x4d) {
LAB_001f6d55:
                    uVar42 = typelist[lVar45];
                    if (((uVar42 & 0x87) != 0) ||
                       ((uVar47 = 0, -1 < (char)bVar22 &&
                        (ppuVar32 = __ctype_b_loc(),
                        (*(byte *)((long)*ppuVar32 + (ulong)bVar22 * 2 + 1) & 8) != 0)))) {
                      ctx_01 = local_c8;
                      if ((uVar42 & 1) != 0) {
                        uVar42 = (int)local_130 + 1;
                        local_130 = (int *)(ulong)uVar42;
                        if ((cmd[lVar45 + 1] == (char *)0x0) ||
                           (((*(byte *)(typelist + lVar45 + 1) & 0x86) == 0 &&
                            ((lVar45 = (long)*cmd[lVar45 + 1], lVar45 < 0 ||
                             (ppuVar32 = __ctype_b_loc(),
                             (*(byte *)((long)*ppuVar32 + lVar45 * 2 + 1) & 8) == 0)))))) {
                          vocerr(ctx_01,7,"An article must be followed by a noun.");
                          *local_f0 = uVar42;
                          uVar47 = 0xffffffff;
                          goto LAB_001f6ffa;
                        }
                      }
                      iVar25 = (int)local_130;
                      uVar46 = (ulong)iVar25;
                      pcVar36 = cmd[uVar46];
                      if (pcVar36 == (char *)0x0) {
                        local_100 = 0xffffffff;
                        local_84 = 0;
                        iVar43 = 0;
                        local_128 = (ulong)local_130 & 0xffffffff;
                      }
                      else {
                        local_100 = 0xffffffff;
                        uVar20 = 0;
                        uVar33 = (ulong)local_130 & 0xffffffff;
                        iVar26 = 0;
                        do {
                          uVar42 = typelist[uVar46];
                          iVar44 = (int)uVar33;
                          iVar43 = iVar26;
                          if ((uVar42 & 2) == 0) {
                            if ((char)uVar42 < '\0') {
                              iVar43 = iVar26 + 1;
                              goto LAB_001f6efe;
                            }
                            local_e4 = iVar26;
                            if ((uVar42 & 4) == 0) {
                              cVar8 = *pcVar36;
                              if (((long)cVar8 < 0) ||
                                 (ppuVar32 = __ctype_b_loc(), iVar26 = extraout_EDX,
                                 (*(byte *)((long)*ppuVar32 + (long)cVar8 * 2 + 1) & 8) == 0)) {
                                uVar42 = voc_check_special(ctx_01,pcVar36,iVar26);
                                uVar46 = (ulong)uVar42;
                                local_128 = uVar33;
                                iVar43 = local_e4;
                                if ((uVar42 == 0) || ((int)local_100 != -1)) break;
                                local_128 = (ulong)((2 - (uint)((*(byte *)(typelist +
                                                                          (long)iVar44 + 1) & 1) ==
                                                               0)) + iVar44);
                                local_100 = uVar33;
                              }
                              else {
                                local_128 = (ulong)(iVar44 + 1);
                                iVar43 = local_e4;
                              }
                            }
                            else {
                              uVar42 = iVar44 + 1;
                              if (cmd[(long)iVar44 + 1] == (char *)0x0) {
                                uVar46 = 0;
                                ctx_01 = local_c8;
                                local_128 = (ulong)uVar42;
                                break;
                              }
                              lVar45 = (long)*cmd[(long)iVar44 + 1];
                              uVar47 = uVar42;
                              if (-1 < lVar45) {
                                ppuVar32 = __ctype_b_loc();
                                iVar26 = extraout_EDX_00;
                                uVar47 = iVar44 + 2;
                                if ((*(byte *)((long)*ppuVar32 + lVar45 * 2 + 1) & 8) == 0) {
                                  uVar47 = uVar42;
                                }
                              }
                              ctx_01 = local_c8;
                              local_128 = (ulong)uVar47;
                              uVar46 = (ulong)(int)uVar47;
                              iVar43 = local_e4;
                              if (cmd[uVar46] == (char *)0x0) break;
                              uVar42 = voc_check_special(local_c8,cmd[uVar46],iVar26);
                              uVar46 = (ulong)uVar42;
                              iVar43 = local_e4;
                              if (uVar42 == 0) break;
                            }
                          }
                          else {
LAB_001f6efe:
                            local_128 = (ulong)(iVar44 + 1);
                          }
                          uVar46 = (ulong)(int)local_128;
                          if ((cmd[uVar46] != (char *)0x0) &&
                             ((*(byte *)(typelist + uVar46) & 0x40) != 0)) {
                            uVar20 = 1;
                          }
                          pcVar36 = cmd[uVar46];
                          uVar33 = local_128;
                          iVar26 = iVar43;
                        } while (pcVar36 != (char *)0x0);
                        local_84 = (undefined4)CONCAT71((int7)(uVar46 >> 8),uVar20);
                      }
                      voc_make_obj_name(ctx_01,(char *)local_98,cmd,iVar25,(uint)local_128);
                      *local_f0 = (uint)local_128;
                      if (iVar43 < 1) {
                        local_a0 = (long)iVar25;
                        local_b4 = iVar25 + 1;
                        local_a8 = -1;
                        local_b8 = 0;
                        local_a4 = 0;
                        local_e4 = iVar43;
LAB_001f7302:
                        lVar45 = local_a0;
                        local_114 = vocgol(ctx_01,&local_e0->vocolobj,(uint *)local_80,cmd,typelist,
                                           iVar25,iVar25,(uint)local_128,(int)local_100);
                        pcVar36 = cmd[lVar45];
                        cVar8 = *pcVar36;
                        lVar45 = (long)cVar8;
                        if (lVar45 < 0) {
                          uVar42 = 0;
                          lVar40 = extraout_RDX_03;
                        }
                        else {
                          ppuVar32 = __ctype_b_loc();
                          bVar22 = (*(byte *)((long)*ppuVar32 + lVar45 * 2 + 1) & 8) >> 3 &
                                   (byte)local_84;
                          lVar40 = extraout_RDX_04;
                          uVar42 = (uint)bVar22;
                          if ((-1 < cVar8) && (bVar22 == 0)) {
                            ppuVar32 = __ctype_b_loc();
                            lVar40 = extraout_RDX_05;
                            uVar42 = 0;
                            if (((*(byte *)((long)*ppuVar32 + lVar45 * 2 + 1) & 8) != 0) &&
                               (uVar42 = 0, (uint)local_128 != local_b4)) {
                              iVar43 = atoi(pcVar36);
                              uVar42 = (uint)(iVar43 == 1);
                              lVar40 = extraout_RDX_06;
                            }
                          }
                        }
                        if ((int)local_114 < 1) {
                          if (chkact != 0) goto LAB_001f6bad;
                          if ((cVar8 < '\0') ||
                             (ppuVar32 = __ctype_b_loc(),
                             (*(byte *)((long)*ppuVar32 + lVar45 * 2 + 1) & 8) == 0)) {
                            uVar47 = 0xffffffff;
                            if (local_114 == 0) {
                              vocerr(local_c8,9,"I don\'t see any %s here.",local_98);
                            }
                            goto LAB_001f6ffa;
                          }
                          if (uVar42 == 0) {
                            local_d8[(int)uVar24].vocolobj = 0xffff;
                            local_d8[(int)uVar24].vocolflg = 0x10;
                            pcVar36 = cmd[local_a0];
                            local_d8[(int)uVar24].vocollst = pcVar36;
                            local_d8[(int)uVar24].vocolfst = pcVar36;
                            *local_f0 = iVar25 + 1;
                            uVar47 = uVar24 + 1;
                            local_d8[(int)uVar47].vocolobj = 0xffff;
                            local_d8[(int)uVar47].vocolflg = 0;
                            goto LAB_001f6ffa;
                          }
                          local_cc = 0;
                          local_b8 = 1;
                          lVar40 = extraout_RDX_07;
                          uVar42 = local_cc;
                        }
LAB_001f7407:
                        local_cc = uVar42;
                        uVar48 = local_b4;
                        if ((int)local_b4 < (int)(uint)local_128) {
                          do {
                            iVar43 = voc_check_special(ctx_01,cmd[(int)uVar48],(int)lVar40);
                            pvVar38 = local_78;
                            uVar27 = 0x13;
                            uVar46 = local_100;
                            lVar40 = extraout_RDX_08;
                            if ((iVar43 == 0) && ((*(byte *)(typelist + (int)uVar48) & 1) == 0)) {
                              iVar43 = (int)local_128;
                              uVar42 = vocgol(ctx_01,&local_78->vocolobj,(uint *)local_90,cmd,
                                              typelist,iVar25,uVar48,iVar43,(int)local_100);
                              if ((int)uVar42 < 0) {
                                ctx_01->voc_stk_cur = (uchar *)local_e0;
                                uVar39 = 0xffffffff;
                                uVar27 = 1;
                                lVar40 = extraout_RDX_09;
                              }
                              else {
                                if (local_114 == 0) {
                                  memcpy(local_e0,pvVar38,(ulong)(uVar42 * 2 + 2));
                                  memcpy(local_80,local_90,(ulong)uVar42 << 2);
                                  lVar40 = extraout_RDX_11;
                                }
                                else {
                                  uVar42 = vocisect_flags(&local_e0->vocolobj,(uint *)local_80,
                                                          &pvVar38->vocolobj,(uint *)local_90);
                                  lVar40 = extraout_RDX_10;
                                }
                                uVar27 = 0;
                                local_114 = uVar42;
                                if (uVar42 == 0) {
                                  if ((ctx_01->voccxflg & 4) != 0) {
                                    outformat("... can\'t find any objects matching these words\\n")
                                    ;
                                  }
                                  lVar40 = local_a0;
                                  if ((int)local_100 == -1) {
                                    if (local_cc != 0) {
                                      uVar27 = 0x10;
                                      local_cc = 0;
                                      if ((ctx_01->voccxflg & 4) == 0) {
                                        local_b8 = 1;
                                      }
                                      else {
                                        local_b8 = 1;
                                        outformat(
                                                 "... treating the number as a count and retrying\\n"
                                                 );
                                        lVar40 = extraout_RDX_15;
                                      }
                                      local_114 = 0;
                                      uVar46 = 0xffffffff;
                                      goto LAB_001f74bd;
                                    }
                                    lVar45 = (long)iVar43;
                                    local_100 = local_128;
                                    do {
                                      lVar45 = lVar45 + -1;
                                      uVar48 = (int)local_100 - 1;
                                      local_100 = (ulong)uVar48;
                                      if (lVar45 <= local_a0) {
                                        if (chkact == 0) {
                                          if (local_bc != 0) {
                                            vocerr(ctx_01,9,"I don\'t see any %s here.",local_98);
                                            lVar40 = extraout_RDX_14;
                                          }
                                          if (no_match != (int *)0x0) {
                                            *no_match = 1;
                                          }
                                        }
                                        ctx_01->voc_stk_cur = (uchar *)local_e0;
                                        uVar27 = 1;
                                        local_cc = 0;
                                        local_114 = 0;
                                        uVar39 = 0;
                                        uVar46 = 0xffffffff;
                                        goto LAB_001f74bd;
                                      }
                                    } while ((*(byte *)(typelist + lVar45) & 8) == 0);
                                    if ((ctx_01->voccxflg & 4) != 0) {
                                      outformat("... changing word to prep and retrying\\n");
                                      lVar40 = extraout_RDX_13;
                                    }
                                    local_cc = 0;
                                  }
                                  else if ((ctx_01->voccxflg & 4) != 0) {
                                    outformat("... dropping the part after OF and retrying\\n");
                                    lVar40 = extraout_RDX_12;
                                  }
                                  local_a4 = local_a4 | 0x4000;
                                  local_114 = 0;
                                  uVar27 = 0xc;
                                  uVar46 = 0xffffffff;
                                  local_128 = local_100;
                                  local_a8 = iVar43;
                                }
                              }
                            }
LAB_001f74bd:
                            uVar47 = (uint)uVar39;
                            local_100 = uVar46;
                            if (uVar27 < 0x10) {
                              if (uVar27 != 0) {
                                if (uVar27 != 0xc) goto LAB_001f7013;
                                voc_make_obj_name(ctx_01,(char *)local_98,cmd,iVar25,(uint)local_128
                                                 );
                                *local_f0 = (uint)local_128;
                                iVar43 = local_e4;
                                if (local_e4 < 1) goto LAB_001f7302;
                                goto LAB_001f7251;
                              }
                            }
                            else {
                              uVar42 = local_cc;
                              if (uVar27 == 0x10) goto LAB_001f7407;
                              if (uVar27 != 0x13) goto LAB_001f7013;
                            }
                            uVar48 = uVar48 + 1;
                            if ((int)(uint)local_128 <= (int)uVar48) break;
                          } while( true );
                        }
                        if ((ctx_01->voccxflg & 4) != 0) {
                          outformat("... found objects matching vocabulary:\\n");
                        }
                        uVar47 = uVar24;
                        if (0 < (int)local_114) {
                          bVar50 = local_b8 != 0;
                          lVar45 = (long)local_a8;
                          pvVar38 = (vocoldef *)(ulong)local_114;
                          piVar37 = local_68 + (long)pvVar31 * 10;
                          pvVar34 = (vocoldef *)0x0;
                          local_90 = pvVar38;
                          local_78 = pvVar31;
                          do {
                            if ((local_c8->voccxflg & 4) != 0) {
                              outformat("..... ");
                              runpprop(local_c8->voccxrun,(uchar **)0x0,0,0,
                                       (&local_e0->vocolobj)[(long)pvVar34],8,0,0,
                                       (&local_e0->vocolobj)[(long)pvVar34]);
                              outflushn(1);
                              pvVar38 = local_90;
                            }
                            *(char **)(piVar37 + -6) = cmd[local_a0];
                            *(char **)(piVar37 + -4) = cmd[(long)(int)(uint)local_128 + -1];
                            *piVar37 = *(uint *)(&local_80->vocolobj + (long)pvVar34 * 2) |
                                       (uint)bVar50 << 5 | local_a4;
                            if (local_a4 != 0) {
                              *(char **)(piVar37 + -2) = cmd[lVar45 + -1];
                            }
                            if (bVar49) {
                              *(byte *)piVar37 = (byte)*piVar37 | 0x80;
                            }
                            ((vocoldef *)(piVar37 + -8))->vocolobj =
                                 (&local_e0->vocolobj)[(long)pvVar34];
                            if ((vocoldef *)(ulong)(200 - uVar24) == pvVar34) {
                              vocerr(local_c8,10,
                                     "You\'re referring to too many objects with \"%s\".",local_98);
                              uVar47 = 0xfffffffe;
                              goto LAB_001f6ffa;
                            }
                            pvVar34 = (vocoldef *)((long)&pvVar34->vocolobj + 1);
                            piVar37 = piVar37 + 10;
                          } while (pvVar38 != pvVar34);
                          uVar47 = (int)local_78 + (int)pvVar34;
                          ctx_01 = local_c8;
                        }
                        pvVar38 = local_d8;
                        if (((local_b4 == (uint)local_128) &&
                            (cVar8 = *cmd[local_a0], -1 < (long)cVar8)) &&
                           (ppuVar32 = __ctype_b_loc(),
                           (*(byte *)((long)*ppuVar32 + (long)cVar8 * 2 + 1) & 8) != 0)) {
                          pvVar38[(int)uVar47].vocolobj = ctx_01->voccxnum;
                          pvVar38[(int)uVar47].vocolflg = 0x10;
                          pcVar36 = cmd[local_a0];
                          pvVar38[(int)uVar47].vocollst = pcVar36;
                          pvVar38[(int)uVar47].vocolfst = pcVar36;
                          uVar47 = uVar47 + 1;
                        }
                        pvVar38[(int)uVar47].vocolobj = 0xffff;
                        pvVar38[(int)uVar47].vocolflg = 0;
                      }
                      else {
LAB_001f7251:
                        uVar47 = uVar24;
                        if (0 < iVar43) {
                          piVar37 = local_68 + (long)pvVar31 * 10;
                          uVar47 = uVar24 + iVar43;
                          iVar43 = iVar43 + 1;
                          do {
                            ((vocoldef *)(piVar37 + -8))->vocolobj = 0xffff;
                            *piVar37 = 0x800;
                            *(char **)(piVar37 + -6) = cmd[iVar25];
                            *(char **)(piVar37 + -4) = cmd[(long)(int)(uint)local_128 + -1];
                            piVar37 = piVar37 + 10;
                            iVar43 = iVar43 + -1;
                          } while (1 < iVar43);
                        }
                        local_d8[(int)uVar47].vocolobj = 0xffff;
                        local_d8[(int)uVar47].vocolflg = 0;
                      }
                    }
                    goto LAB_001f6ffa;
                  }
                  iVar25 = 0x100;
                }
              }
              else if (bVar22 == 0x52) {
                iVar25 = 0x200;
              }
              else {
                if (bVar22 != 0x54) goto LAB_001f6d55;
                iVar25 = 8;
              }
              local_d8[(int)uVar24].vocolflg = iVar25;
              if ((ctx_01->voccxflg & 4) != 0) {
                outformat("... found pronoun\\n");
              }
              *local_f0 = (int)local_130 + 1;
              pvVar38[(int)uVar24].vocolobj = 0xffff;
              pcVar36 = cmd[lVar45];
              pvVar38[(int)uVar24].vocollst = pcVar36;
              pvVar38[(int)uVar24].vocolfst = pcVar36;
              pvVar31 = (vocoldef *)(ulong)(uVar24 + 1);
              goto LAB_001f6918;
            }
            if (chkact != 0) goto LAB_001f6bad;
            if ((ctx_01->voccxflg & 4) != 0) {
              outformat("... found ALL\\n");
            }
            local_d8[(int)uVar24].vocolobj = 0xffff;
            local_d8[(int)uVar24].vocolflg = 1;
            pcVar36 = cmd[lVar45];
            local_d8[(int)uVar24].vocollst = pcVar36;
            local_d8[(int)uVar24].vocolfst = pcVar36;
            uVar48 = uVar24 + 1;
            uVar42 = (int)local_130 + 1;
            if ((cmd[lVar45 + 1] != (char *)0x0) && (*cmd[lVar45 + 1] == 'X')) {
              if ((ctx_01->voccxflg & 4) != 0) {
                outformat("... found ALL EXCEPT\\n");
              }
              pvVar38 = (vocoldef *)ctx_01->voc_stk_cur;
              ctx = ctx_01;
              if ((vocoldef *)ctx_01->voc_stk_end < pvVar38 + 200) break;
              ctx_01->voc_stk_cur = (uchar *)(pvVar38 + 200);
              uVar42 = (int)local_130 + 2;
              uVar27 = vocgobj(ctx_01,cmd,typelist,uVar42,(int *)local_f0,local_bc,pvVar38,1,0,
                               (int *)0x0);
              pvVar34 = local_e0;
              uVar47 = uVar27;
              if ((-1 < (int)uVar27) &&
                 (uVar42 = *local_f0, pvVar34 = pvVar38, uVar47 = (uint)uVar39, uVar27 != 0)) {
                uVar48 = uVar27 + uVar24 + 1;
                lVar45 = 0;
                do {
                  uVar39 = *(undefined8 *)((long)&pvVar38->vocolflg + lVar45);
                  *(undefined8 *)((long)local_58 + lVar45 + (long)pvVar31 * 0x28) = uVar39;
                  puVar5 = (undefined8 *)((long)&pvVar38->vocolobj + lVar45);
                  uVar35 = *puVar5;
                  uVar18 = puVar5[1];
                  puVar5 = (undefined8 *)((long)&pvVar38->vocollst + lVar45);
                  uVar19 = puVar5[1];
                  puVar4 = (undefined8 *)((long)local_58 + lVar45 + (long)pvVar31 * 0x28 + -0x10);
                  *puVar4 = *puVar5;
                  puVar4[1] = uVar19;
                  puVar5 = (undefined8 *)((long)local_58 + lVar45 + (long)pvVar31 * 0x28 + -0x20);
                  *puVar5 = uVar35;
                  puVar5[1] = uVar18;
                  *(byte *)((long)local_58 + lVar45 + (long)pvVar31 * 0x28) = (byte)uVar39 | 2;
                  lVar45 = lVar45 + 0x28;
                } while ((ulong)uVar27 * 0x28 != lVar45);
              }
              ctx_01->voc_stk_cur = (uchar *)pvVar34;
              if ((int)uVar27 < 0) goto LAB_001f7013;
            }
            uVar47 = uVar48;
            *local_f0 = uVar42;
            local_d8[(int)uVar47].vocolobj = 0xffff;
            local_d8[(int)uVar47].vocolflg = 0;
            goto LAB_001f6ffa;
          }
          if (chkact == 0) {
            bVar49 = bVar22 == 0x59;
            iVar25 = voc_check_special(ctx_01,cmd[(long)(int)uVar48 + 1],uVar42);
            uVar35 = extraout_RDX_00;
            if (iVar25 == 0) {
              uVar42 = uVar48 + 1;
            }
            else {
              if ((ctx_01->voccxflg & 4) != 0) {
                outformat("... found ALL/ANY/BOTH/EITHER OF\\n");
                uVar35 = extraout_RDX_01;
              }
              pvVar38 = local_e0;
              if (cmd[(long)(int)uVar48 + 2] == (char *)0x0) {
                if (*cmd[lVar45] == 'A') {
                  iVar25 = 4;
                  pcVar36 = "I think you left something out after \"all of\".";
                }
                else if (*cmd[lVar45] == 'Y') {
                  iVar25 = 0x1d;
                  pcVar36 = "I think you left something out after \"any of\".";
                }
                else {
                  iVar25 = 5;
                  pcVar36 = "There\'s something missing after \"both of\".";
                }
                vocerr(ctx_01,iVar25,pcVar36);
                ctx_01->voc_stk_cur = (uchar *)pvVar38;
                uVar39 = 0xffffffff;
                goto LAB_001f69dc;
              }
              uVar42 = uVar48 + 2;
            }
            iVar43 = uVar42 + (typelist[(int)uVar42] & 1U);
            while( true ) {
              if (cmd[iVar43] == (char *)0x0) break;
              iVar26 = voc_check_special(ctx_01,cmd[iVar43],(int)uVar35);
              uVar35 = extraout_RDX_02;
              if (iVar26 == 0) {
                if ((*(byte *)(typelist + iVar43) & 6) == 0) break;
LAB_001f6aa9:
                iVar43 = iVar43 + 1;
              }
              else {
                if ((byte *)cmd[(long)iVar43 + 1] == (byte *)0x0) {
                  bVar50 = false;
                  vocerr(ctx_01,6,"I expected a noun after \"of\".");
                  ctx_01->voc_stk_cur = (uchar *)local_e0;
                  uVar39 = 0xffffffff;
                  goto LAB_001f6b81;
                }
                if ((*cmd[(long)iVar43 + 1] & 1U) == 0) goto LAB_001f6aa9;
                iVar43 = iVar43 + 2;
              }
            }
            bVar50 = true;
            if (((int)uVar48 < iVar43) &&
               ((bVar50 = true, bVar22 == 0x59 && iVar25 == 0 ||
                ((typelist[(long)iVar43 + -1] & 0x40U) != 0)))) {
              if ((ctx_01->voccxflg & 4) != 0) {
                outformat("... found ALL/ANY/BOTH/EITHER + noun phrase\\n");
              }
              local_130 = (int *)(ulong)uVar42;
            }
          }
          else {
            ctx_01->voc_stk_cur = (uchar *)local_e0;
            bVar49 = false;
            uVar39 = 0;
LAB_001f69dc:
            bVar50 = false;
          }
LAB_001f6b81:
          uVar47 = (uint)uVar39;
          if (bVar50) goto LAB_001f6b8f;
        }
        else {
          if (iVar25 != 3) goto LAB_001f6ffa;
LAB_001f6918:
          uVar47 = (uint)pvVar31;
LAB_001f6ffa:
          local_c8->voc_stk_cur = (uchar *)local_e0;
          ctx_01 = local_c8;
        }
LAB_001f7013:
        pvVar38 = local_d8;
        if ((int)uVar47 < 0) goto LAB_001f7afe;
        uVar42 = uVar41;
        if (uVar47 != 0) {
          uVar48 = 200;
          if (200 < (int)uVar41) {
            uVar48 = uVar41;
          }
          lVar45 = 0;
          do {
            *(undefined8 *)((long)&nounlist[(int)uVar41].vocolflg + lVar45) =
                 *(undefined8 *)((long)&local_d8->vocolflg + lVar45);
            puVar28 = (uchar *)((long)&local_d8->vocolobj + lVar45);
            uVar11 = *(undefined4 *)puVar28;
            uVar12 = *(undefined4 *)(puVar28 + 4);
            uVar13 = *(undefined4 *)(puVar28 + 8);
            uVar14 = *(undefined4 *)(puVar28 + 0xc);
            puVar6 = (undefined4 *)((long)&local_d8->vocollst + lVar45);
            uVar15 = puVar6[1];
            uVar16 = puVar6[2];
            uVar17 = puVar6[3];
            puVar7 = (undefined4 *)((long)&nounlist[(int)uVar41].vocollst + lVar45);
            *puVar7 = *puVar6;
            puVar7[1] = uVar15;
            puVar7[2] = uVar16;
            puVar7[3] = uVar17;
            puVar6 = (undefined4 *)((long)&nounlist[(int)uVar41].vocolobj + lVar45);
            *puVar6 = uVar11;
            puVar6[1] = uVar12;
            puVar6[2] = uVar13;
            puVar6[3] = uVar14;
            if ((ulong)(uVar48 - uVar41) * 0x28 == lVar45) {
              vocerr(ctx_01,0xb,"You\'re referring to too many objects.");
              uVar47 = 0xffffffff;
              goto LAB_001f7afe;
            }
            lVar45 = lVar45 + 0x28;
            uVar42 = uVar42 + 1;
          } while ((ulong)uVar47 * 0x28 != lVar45);
        }
        uVar41 = uVar42;
        if (uVar47 == 0) {
          if ((local_6c & 1) == 0) {
            *local_f0 = (uint)local_60;
          }
LAB_001f7ae6:
          nounlist[(int)uVar41].vocolobj = 0xffff;
          nounlist[(int)uVar41].vocolflg = 0;
          uVar47 = uVar41;
LAB_001f7afe:
          ctx_01->voc_stk_cur = (uchar *)pvVar38;
          return uVar47;
        }
        if ((char)local_48 != '\0') goto LAB_001f7ae6;
        local_60 = (int *)(long)(int)*local_f0;
        if (((local_60 == (int *)0xffffffffffffffff) || (cmd[(long)local_60] == (char *)0x0)) ||
           (*cmd[(long)local_60] != ',')) goto LAB_001f7ae6;
        pcVar36 = cmd[(long)local_60];
        piVar37 = local_60;
        local_130 = (int *)(ulong)*local_f0;
        while ((pcVar36 != (char *)0x0 && (local_130 = piVar37, *pcVar36 == ','))) {
          puVar21 = (undefined1 *)((long)piVar37 + 1);
          piVar37 = (int *)((long)piVar37 + 1);
          local_130 = piVar37;
          pcVar36 = cmd[(long)puVar21];
        }
        local_bc = (uint)(local_bc != 0) * 2;
        pvVar38 = (vocoldef *)ctx_01->voc_stk_cur;
        pvVar31 = (vocoldef *)ctx_01->voc_stk_end;
        pvVar30 = pvVar38 + 10;
        uVar42 = 0;
        ctx = ctx_01;
      } while (pvVar30 <= pvVar31);
    }
  }
  errsigf(ctx->voccxerr,"TADS",0x417);
}

Assistant:

int vocgobj(voccxdef *ctx, char *cmd[], int typelist[],
            int cur, int *next, int complain, vocoldef *nounlist,
            int multi, int chkact, int *no_match)
{
    int       cnt;
    int       outcnt = 0;
    int       i;
    int       again = FALSE;
    int       lastcur;
    vocoldef *tmplist;
    uchar    *save_sp;

    voc_enter(ctx, &save_sp);
    VOC_MAX_ARRAY(ctx, vocoldef, tmplist);

    for ( ;; )
    {
        /* try getting a single object */
        cnt = vocg1o(ctx, cmd, typelist, cur, next, complain,
                     tmplist, chkact, no_match);

        /* if we encountered a syntax error, return failure */
        if (cnt < 0)
        {
            VOC_RETVAL(ctx, save_sp, cnt);
        }

        /* if we got any objects, store them in our output list */
        if (cnt > 0)
        {
            for (i = 0 ; i < cnt ; ++i)
            {
                OSCPYSTRUCT(nounlist[outcnt], tmplist[i]);
                if (++outcnt > VOCMAXAMBIG)
                {
                    vocerr(ctx, VOCERR(11),
                           "You're referring to too many objects.");
                    VOC_RETVAL(ctx, save_sp, -1);
                }
            }
        }

        /* if we didn't find any objects, stop looking */
        if (cnt == 0)
        {
            if (again)
                *next = lastcur;
            break;
        }

        /* 
         *   if the caller only wanted a single object (or is getting an
         *   actor, in which case they implicitly want only a single
         *   object), stop looking for additional noun phrases 
         */
        if (!multi || chkact)
            break;

        /* skip past the previous noun phrase */
        cur = *next;

        /* 
         *   if we're looking at a noun phrase separator ("and" or a
         *   comma), get the next noun phrase; otherwise, we're done 
         */
        if (cur != -1 && cmd[cur] != 0 && vocspec(cmd[cur], VOCW_AND))
        {
            lastcur = cur;
            while (cmd[cur] && vocspec(cmd[cur], VOCW_AND)) ++cur;
            again = TRUE;
            if (complain) complain = 2;
        }
        else
        {
            /* end of line, or not at a separator - we're done */
            break;
        }
    }

    /* terminate the list and return the number of objects we found */
    nounlist[outcnt].vocolobj = MCMONINV;
    nounlist[outcnt].vocolflg = 0;
    VOC_RETVAL(ctx, save_sp, outcnt);
}